

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_avx2.c
# Opt level: O2

void aom_get_blk_sse_sum_avx2(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  int iVar1;
  uint loop_count;
  bool bVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_stack_00000008 [32];
  undefined1 in_stack_00000028 [32];
  
  *x_sum = 0;
  *x2_sum = 0;
  if ((bh & 3U) != 0) {
LAB_00312abb:
    aom_get_blk_sse_sum_c(data,stride,bw,bh,x_sum,x2_sum);
    return;
  }
  if (bw != 0x40) {
    if (bw == 8) {
      iVar1 = 0;
      if (0 < bh >> 1) {
        iVar1 = bh >> 1;
      }
      auVar3 = ZEXT1664((undefined1  [16])0x0);
      auVar5 = ZEXT1664((undefined1  [16])0x0);
      auVar7._8_2_ = 1;
      auVar7._0_8_ = 0x1000100010001;
      auVar7._10_2_ = 1;
      auVar7._12_2_ = 1;
      auVar7._14_2_ = 1;
      auVar7._16_2_ = 1;
      auVar7._18_2_ = 1;
      auVar7._20_2_ = 1;
      auVar7._22_2_ = 1;
      auVar7._24_2_ = 1;
      auVar7._26_2_ = 1;
      auVar7._28_2_ = 1;
      auVar7._30_2_ = 1;
      while( true ) {
        auVar4 = auVar5._0_32_;
        bVar2 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if (bVar2) break;
        auVar10._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])data + (long)stride * 2) +
             ZEXT116(1) * *(undefined1 (*) [16])data;
        auVar10._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])data + (long)stride * 2);
        auVar6 = vpmaddwd_avx2(auVar10,auVar7);
        auVar10 = vpmaddwd_avx2(auVar10,auVar10);
        auVar6 = vpaddd_avx2(auVar6,auVar3._0_32_);
        auVar3 = ZEXT3264(auVar6);
        auVar4 = vpaddd_avx2(auVar10,auVar4);
        auVar5 = ZEXT3264(auVar4);
        data = (int16_t *)(*(undefined1 (*) [16])data + (long)(stride * 2) * 2);
      }
    }
    else {
      if ((bw == 0x10) || (bw == 0x20)) {
        loop_count = (uint)bw >> 4;
        goto LAB_00312b99;
      }
      if (bw != 4) goto LAB_00312abb;
      iVar1 = 0;
      if (0 < bh >> 2) {
        iVar1 = bh >> 2;
      }
      auVar3 = ZEXT1664((undefined1  [16])0x0);
      auVar5 = ZEXT1664((undefined1  [16])0x0);
      auVar6._8_2_ = 1;
      auVar6._0_8_ = 0x1000100010001;
      auVar6._10_2_ = 1;
      auVar6._12_2_ = 1;
      auVar6._14_2_ = 1;
      auVar6._16_2_ = 1;
      auVar6._18_2_ = 1;
      auVar6._20_2_ = 1;
      auVar6._22_2_ = 1;
      auVar6._24_2_ = 1;
      auVar6._26_2_ = 1;
      auVar6._28_2_ = 1;
      auVar6._30_2_ = 1;
      while( true ) {
        auVar4 = auVar5._0_32_;
        bVar2 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if (bVar2) break;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)((long)data + (long)stride * 2);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)data;
        auVar8 = vpunpcklqdq_avx(auVar11,auVar8);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)((long)data + (long)(stride * 3) * 2);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)data + (long)(stride * 2) * 2);
        auVar11 = vpunpcklqdq_avx(auVar13,auVar12);
        auVar9._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar8;
        auVar9._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
        auVar7 = vpmaddwd_avx2(auVar9,auVar6);
        auVar10 = vpmaddwd_avx2(auVar9,auVar9);
        auVar7 = vpaddd_avx2(auVar7,auVar3._0_32_);
        auVar3 = ZEXT3264(auVar7);
        auVar7 = vpaddd_avx2(auVar10,auVar4);
        auVar5 = ZEXT3264(auVar7);
        data = (int16_t *)((long)data + (long)(stride << 2) * 2);
      }
    }
    auVar6 = vpunpckldq_avx2(auVar4,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar7 = vpunpckhdq_avx2(auVar4,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    vpaddq_avx2(auVar6,auVar7);
    accumulate_sse_sum((__m256i)in_stack_00000008,(__m256i)in_stack_00000028,x_sum,x2_sum);
    return;
  }
  if (bh < 0x21) {
    loop_count = 4;
  }
  else {
    bh = 0x20;
    loop_count = 4;
    sse_sum_wd16_avx2(data,stride,0x20,x_sum,x2_sum,4);
    data = data + (stride << 5);
  }
LAB_00312b99:
  sse_sum_wd16_avx2(data,stride,bh,x_sum,x2_sum,loop_count);
  return;
}

Assistant:

void aom_get_blk_sse_sum_avx2(const int16_t *data, int stride, int bw, int bh,
                              int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;

  if ((bh & 3) == 0) {
    switch (bw) {
        // For smaller block widths, compute multiple rows simultaneously.
      case 4: sse_sum_wd4_avx2(data, stride, bh, x_sum, x2_sum); break;
      case 8: sse_sum_wd8_avx2(data, stride, bh, x_sum, x2_sum); break;
      case 16:
      case 32:
        sse_sum_wd16_avx2(data, stride, bh, x_sum, x2_sum, bw >> 4);
        break;
      case 64:
        // 32-bit variables will overflow for 64 rows at a single time, so
        // compute 32 rows at a time.
        if (bh <= 32) {
          sse_sum_wd16_avx2(data, stride, bh, x_sum, x2_sum, bw >> 4);
        } else {
          sse_sum_wd16_avx2(data, stride, 32, x_sum, x2_sum, bw >> 4);
          sse_sum_wd16_avx2(data + 32 * stride, stride, 32, x_sum, x2_sum,
                            bw >> 4);
        }
        break;

      default: aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
    }
  } else {
    aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
  }
}